

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O2

int __thiscall Fl_Widget::take_focus(Fl_Widget *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((this->flags_ & 0x207) == 0x200) {
    iVar1 = (*this->_vptr_Fl_Widget[3])(this,6);
    if (iVar1 != 0) {
      iVar1 = contains(this,Fl::focus_);
      iVar2 = 1;
      if (iVar1 == 0) {
        Fl::focus(this);
      }
    }
  }
  return iVar2;
}

Assistant:

int Fl_Widget::take_focus() {
  if (!takesevents()) return 0;
  if (!visible_focus()) return 0;
  if (!handle(FL_FOCUS)) return 0; // see if it wants it
  if (contains(Fl::focus())) return 1; // it called Fl::focus for us
  Fl::focus(this);
  return 1;
}